

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int emit_push_const(JSParseState *s,JSValue val,BOOL as_atom)

{
  uint8_t val_00;
  JSAtom val_01;
  JSValueUnion p_00;
  JSRefCountHeader *p;
  
  p_00 = val.u;
  if (as_atom != 0 && (uint)val.tag == 0xfffffff9) {
    *(int *)p_00.ptr = *p_00.ptr + 1;
    val_01 = JS_NewAtomStr(s->ctx,(JSString *)p_00.ptr);
    if (0 < (int)val_01) {
      val_00 = '\x04';
      goto LAB_0014c618;
    }
  }
  if (0xfffffff4 < (uint)val.tag) {
    *(int *)p_00.ptr = *p_00.ptr + 1;
  }
  val_01 = cpool_add(s,val);
  if ((int)val_01 < 0) {
    return -1;
  }
  val_00 = '\x02';
LAB_0014c618:
  emit_op(s,val_00);
  emit_u32(s,val_01);
  return 0;
}

Assistant:

static __exception int emit_push_const(JSParseState *s, JSValueConst val,
                                       BOOL as_atom)
{
    int idx;

    if (JS_VALUE_GET_TAG(val) == JS_TAG_STRING && as_atom) {
        JSAtom atom;
        /* warning: JS_NewAtomStr frees the string value */
        JS_DupValue(s->ctx, val);
        atom = JS_NewAtomStr(s->ctx, JS_VALUE_GET_STRING(val));
        if (atom != JS_ATOM_NULL && !__JS_AtomIsTaggedInt(atom)) {
            emit_op(s, OP_push_atom_value);
            emit_u32(s, atom);
            return 0;
        }
    }

    idx = cpool_add(s, JS_DupValue(s->ctx, val));
    if (idx < 0)
        return -1;
    emit_op(s, OP_push_const);
    emit_u32(s, idx);
    return 0;
}